

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int unres_data_diff_new(unres_data *unres,lyd_node *subtree,lyd_node *parent,int created)

{
  uint uVar1;
  int iVar2;
  lyd_node *in_RAX;
  lys_module *plVar3;
  lyd_node *second;
  lyd_node *local_28;
  char *buf;
  
  if (created != 0) {
    uVar1 = unres->diff_idx;
    unres->diff_idx = uVar1 + 1;
    iVar2 = lyd_difflist_add(unres->diff,&unres->diff_size,uVar1,LYD_DIFF_CREATED,(lyd_node *)0x0,
                             subtree);
    return iVar2;
  }
  if (parent == (lyd_node *)0x0) {
    second = (lyd_node *)0x0;
    local_28 = in_RAX;
  }
  else {
    local_28 = (lyd_node *)0x0;
    iVar2 = ly_vlog_build_path(LY_VLOG_LYD,parent,(char **)&local_28,0,0);
    second = local_28;
    if (local_28 == (lyd_node *)0x0 || iVar2 != 0) {
      plVar3 = subtree->schema->module;
      if ((plVar3->field_0x40 & 1) != 0) {
        plVar3 = (lys_module *)plVar3->data;
      }
      ly_log(plVar3->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","unres_data_diff_new");
      return -1;
    }
  }
  uVar1 = unres->diff_idx;
  unres->diff_idx = uVar1 + 1;
  iVar2 = lyd_difflist_add(unres->diff,&unres->diff_size,uVar1,LYD_DIFF_DELETED,subtree,second);
  return iVar2;
}

Assistant:

int
unres_data_diff_new(struct unres_data *unres, struct lyd_node *subtree, struct lyd_node *parent, int created)
{
    char *parent_xpath = NULL;

    if (created) {
        return lyd_difflist_add(unres->diff, &unres->diff_size, unres->diff_idx++, LYD_DIFF_CREATED, NULL, subtree);
    } else {
        if (parent) {
            parent_xpath = lyd_path(parent);
            LY_CHECK_ERR_RETURN(!parent_xpath, LOGMEM(lyd_node_module(subtree)->ctx), -1);
        }
        return lyd_difflist_add(unres->diff, &unres->diff_size, unres->diff_idx++, LYD_DIFF_DELETED,
                                subtree, (struct lyd_node *)parent_xpath);
    }
}